

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataParser.cpp
# Opt level: O0

void __thiscall firmata::FirmataParser::processSysexMessage(FirmataParser *this)

{
  size_t sVar1;
  size_t end_of_string_1;
  size_t string_offset_1;
  size_t end_of_string;
  size_t string_offset;
  size_t minor_version_offset;
  size_t major_version_offset;
  FirmataParser *this_local;
  
  if (*this->dataBuffer == 'q') {
    if (this->currentStringCallback != (stringCallbackFunction)0x0) {
      sVar1 = decodeByteStream(this,this->sysexBytesRead - 1,this->dataBuffer + 1);
      bufferDataAtPosition(this,'\0',sVar1 + 1);
      (*this->currentStringCallback)
                (this->currentStringCallbackContext,(char *)(this->dataBuffer + 1));
    }
  }
  else if (*this->dataBuffer == 'y') {
    if (this->currentReportFirmwareCallback != (versionCallbackFunction)0x0) {
      if (this->sysexBytesRead < 3) {
        (*this->currentReportFirmwareCallback)
                  (this->currentReportFirmwareCallbackContext,0,0,(char *)0x0);
      }
      else {
        sVar1 = decodeByteStream(this,this->sysexBytesRead - 3,this->dataBuffer + 3);
        bufferDataAtPosition(this,'\0',sVar1 + 3);
        (*this->currentReportFirmwareCallback)
                  (this->currentReportFirmwareCallbackContext,(ulong)this->dataBuffer[1],
                   (ulong)this->dataBuffer[2],(char *)(this->dataBuffer + 3));
      }
    }
  }
  else if (this->currentSysexCallback != (sysexCallbackFunction)0x0) {
    (*this->currentSysexCallback)
              (this->currentSysexCallbackContext,*this->dataBuffer,this->sysexBytesRead - 1,
               this->dataBuffer + 1);
  }
  return;
}

Assistant:

void FirmataParser::processSysexMessage(void)
{
  switch (dataBuffer[0]) { //first byte in buffer is command
    case REPORT_FIRMWARE:
      if (currentReportFirmwareCallback) {
        const size_t major_version_offset = 1;
        const size_t minor_version_offset = 2;
        const size_t string_offset = 3;
        // Test for malformed REPORT_FIRMWARE message (used to query firmware prior to Firmata v3.0.0)
        if ( 3 > sysexBytesRead ) {
          (*currentReportFirmwareCallback)(currentReportFirmwareCallbackContext, 0, 0, (const char *)NULL);
        } else {
          const size_t end_of_string = (string_offset + decodeByteStream((sysexBytesRead - string_offset), &dataBuffer[string_offset]));
          bufferDataAtPosition('\0', end_of_string); // NULL terminate the string
          (*currentReportFirmwareCallback)(currentReportFirmwareCallbackContext, (size_t)dataBuffer[major_version_offset], (size_t)dataBuffer[minor_version_offset], (const char *)&dataBuffer[string_offset]);
        }
      }
      break;
    case STRING_DATA:
      if (currentStringCallback) {
        const size_t string_offset = 1;
        const size_t end_of_string = (string_offset + decodeByteStream((sysexBytesRead - string_offset), &dataBuffer[string_offset]));
        bufferDataAtPosition('\0', end_of_string); // NULL terminate the string
        (*currentStringCallback)(currentStringCallbackContext, (const char *)&dataBuffer[string_offset]);
      }
      break;
    default:
      if (currentSysexCallback)
        (*currentSysexCallback)(currentSysexCallbackContext, dataBuffer[0], sysexBytesRead - 1, dataBuffer + 1);
  }
}